

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_DecMffcAreaReal(Abc_Obj_t *pPivot,Vec_Int_t *vCut,Vec_Int_t *vMffc)

{
  int *piVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  if ((*(uint *)&pPivot->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x2cf,"int Sfm_DecMffcAreaReal(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  pAVar3 = pPivot->pNtk;
  if (vMffc != (Vec_Int_t *)0x0) {
    vMffc->nSize = 0;
  }
  iVar7 = vCut->nSize;
  if (0 < iVar7) {
    piVar4 = vCut->pArray;
    pVVar5 = pAVar3->vObjs;
    lVar10 = 0;
    do {
      iVar8 = piVar4[lVar10];
      if (((long)iVar8 < 0) || (pVVar5->nSize <= iVar8)) goto LAB_00526a7f;
      pvVar6 = pVVar5->pArray[iVar8];
      if (pvVar6 != (void *)0x0) {
        piVar1 = (int *)((long)pvVar6 + 0x2c);
        *piVar1 = *piVar1 + 1;
        iVar7 = vCut->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar7);
  }
  iVar8 = Sfm_MffcDeref_rec(pPivot);
  iVar9 = Sfm_MffcRef_rec(pPivot,vMffc);
  iVar7 = vCut->nSize;
  if (0 < iVar7) {
    piVar4 = vCut->pArray;
    pVVar5 = pAVar3->vObjs;
    lVar10 = 0;
    do {
      iVar2 = piVar4[lVar10];
      if (((long)iVar2 < 0) || (pVVar5->nSize <= iVar2)) {
LAB_00526a7f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar6 = pVVar5->pArray[iVar2];
      if (pvVar6 != (void *)0x0) {
        piVar1 = (int *)((long)pvVar6 + 0x2c);
        *piVar1 = *piVar1 + -1;
        iVar7 = vCut->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar7);
  }
  if (iVar8 == iVar9) {
    return iVar8;
  }
  __assert_fail("Area1 == Area2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                ,0x2d8,"int Sfm_DecMffcAreaReal(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Sfm_DecMffcAreaReal( Abc_Obj_t * pPivot, Vec_Int_t * vCut, Vec_Int_t * vMffc )
{
    Abc_Ntk_t * pNtk = pPivot->pNtk;
    Abc_Obj_t * pObj; 
    int i, Area1, Area2;
    assert( Abc_ObjIsNode(pPivot) );
    if ( vMffc )
        Vec_IntClear( vMffc );
    Abc_NtkForEachObjVec( vCut, pNtk, pObj, i )
        pObj->vFanouts.nSize++;
    Area1 = Sfm_MffcDeref_rec( pPivot );
    Area2 = Sfm_MffcRef_rec( pPivot, vMffc );
    Abc_NtkForEachObjVec( vCut, pNtk, pObj, i )
        pObj->vFanouts.nSize--;
    assert( Area1 == Area2 );
    return Area1;
}